

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_well_known_types.pb.cc
# Opt level: O0

void __thiscall
proto2_unittest::OneofWellKnownTypes::set_allocated_timestamp_field
          (OneofWellKnownTypes *this,Timestamp *timestamp_field)

{
  Arena *message_arena_00;
  Arena *submessage_arena_00;
  Arena *submessage_arena;
  Arena *message_arena;
  Timestamp *timestamp_field_local;
  OneofWellKnownTypes *this_local;
  
  message_arena_00 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
  clear_oneof_field(this);
  if (timestamp_field != (Timestamp *)0x0) {
    submessage_arena_00 = google::protobuf::MessageLite::GetArena((MessageLite *)timestamp_field);
    message_arena = (Arena *)timestamp_field;
    if (message_arena_00 != submessage_arena_00) {
      message_arena =
           (Arena *)google::protobuf::internal::GetOwnedMessage<google::protobuf::Timestamp>
                              (message_arena_00,timestamp_field,submessage_arena_00);
    }
    set_has_timestamp_field(this);
    (this->field_0)._impl_.oneof_field_.any_field_ = (Message *)message_arena;
  }
  return;
}

Assistant:

void OneofWellKnownTypes::set_allocated_timestamp_field(::google::protobuf::Timestamp* PROTOBUF_NULLABLE timestamp_field) {
  ::google::protobuf::Arena* message_arena = GetArena();
  clear_oneof_field();
  if (timestamp_field) {
    ::google::protobuf::Arena* submessage_arena = reinterpret_cast<::google::protobuf::Message*>(timestamp_field)->GetArena();
    if (message_arena != submessage_arena) {
      timestamp_field = ::google::protobuf::internal::GetOwnedMessage(message_arena, timestamp_field, submessage_arena);
    }
    set_has_timestamp_field();
    _impl_.oneof_field_.timestamp_field_ = timestamp_field;
  }
  // @@protoc_insertion_point(field_set_allocated:proto2_unittest.OneofWellKnownTypes.timestamp_field)
}